

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O2

void __thiscall duckdb::ReservoirSample::SimpleMerge(ReservoirSample *this,ReservoirSample *other)

{
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true> *this_00;
  sel_t *psVar1;
  idx_t iVar2;
  idx_t iVar3;
  pointer pRVar4;
  ulong uVar5;
  DataChunk *this_;
  DataChunk *other_00;
  pointer pBVar6;
  ulong uVar7;
  sel_t sVar8;
  long lVar9;
  idx_t i;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  double dVar17;
  SelectionVector chunk_sel;
  SelectionVector local_60;
  double local_48;
  double dStack_40;
  
  iVar2 = GetActiveSampleCount(other);
  if ((iVar2 != 0) || (iVar2 = GetTuplesSeen(other), iVar2 != 0)) {
    iVar2 = GetActiveSampleCount(this);
    if ((iVar2 == 0) && (iVar2 = GetTuplesSeen(this), iVar2 == 0)) {
      SelectionVector::SelectionVector(&local_60,&other->sel);
      SelectionVector::operator=(&this->sel,&local_60);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_60.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      this->sel_size = other->sel_size;
      iVar2 = GetTuplesSeen(other);
      pBVar6 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
               ::operator->(&(this->super_BlockingSample).base_reservoir_sample);
      pBVar6->num_entries_seen_total = iVar2;
    }
    else {
      iVar2 = GetTuplesSeen(this);
      iVar3 = GetTuplesSeen(other);
      lVar9 = iVar3 + iVar2;
      iVar2 = GetTuplesSeen(this);
      auVar14._8_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar14._0_8_ = lVar9;
      auVar14._12_4_ = 0x45300000;
      local_48 = (double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0;
      dVar15 = auVar14._8_8_ - 1.9342813113834067e+25;
      dStack_40 = dVar15;
      iVar3 = GetTuplesSeen(other);
      auVar13._0_8_ =
           ((double)(iVar2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
           (double)(iVar2 & 0xffffffff | 0x4330000000000000);
      auVar13._8_8_ =
           ((double)(iVar3 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
           (double)(iVar3 & 0xffffffff | 0x4330000000000000);
      auVar16._0_8_ = local_48 + dVar15;
      auVar16._8_8_ = local_48 + dVar15;
      auVar14 = divpd(auVar13,auVar16);
      dVar15 = auVar14._8_8_;
      dVar12 = auVar14._0_8_;
      uVar11 = -(ulong)(dVar12 + dVar15 < 1.0);
      dVar15 = (double)(~uVar11 & (ulong)dVar15 |
                       (ulong)((1.0 - (dVar12 + dVar15)) + dVar15) & uVar11);
      dVar17 = ((double)CONCAT44(0x45300000,(int)(this->sample_count >> 0x20)) -
               1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)this->sample_count) - 4503599627370496.0);
      if (dVar12 <= dVar15) {
        dVar15 = round(dVar15 * dVar17);
        iVar2 = (long)(dVar15 - 9.223372036854776e+18) & (long)dVar15 >> 0x3f | (long)dVar15;
        iVar3 = GetActiveSampleCount(other);
        if (iVar3 <= iVar2) {
          iVar2 = iVar3;
        }
        uVar11 = this->sample_count - iVar2;
        iVar3 = GetActiveSampleCount(this);
        if (iVar3 <= uVar11) {
          uVar11 = iVar3;
        }
      }
      else {
        dVar15 = round(dVar12 * dVar17);
        uVar11 = (long)(dVar15 - 9.223372036854776e+18) & (long)dVar15 >> 0x3f | (long)dVar15;
        iVar2 = GetActiveSampleCount(this);
        if (iVar2 <= uVar11) {
          uVar11 = iVar2;
        }
        iVar2 = this->sample_count - uVar11;
        iVar3 = GetActiveSampleCount(other);
        if (iVar3 <= iVar2) {
          iVar2 = iVar3;
        }
      }
      uVar7 = iVar2 + uVar11;
      if (0x7ff < uVar7) {
        uVar7 = 0x800;
      }
      this_00 = &this->reservoir_chunk;
      pRVar4 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
               ::operator->(this_00);
      uVar10 = this->sample_count;
      uVar5 = 0x800;
      if (uVar10 < 0x800) {
        uVar5 = uVar10;
      }
      if (uVar5 * 10 + uVar10 < (pRVar4->chunk).count + iVar2) {
        Vacuum(this);
      }
      local_48 = (double)iVar2;
      SelectionVector::SelectionVector(&local_60,iVar2);
      pRVar4 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
               ::operator->(this_00);
      sVar8 = (sel_t)(pRVar4->chunk).count;
      uVar10 = 0;
      for (; uVar11 < uVar7; uVar11 = uVar11 + 1) {
        iVar2 = GetActiveSampleCount(this);
        if (uVar11 < iVar2) {
          (this->sel).sel_vector[uVar11] = sVar8;
        }
        else {
          iVar2 = GetActiveSampleCount(this);
          (this->sel).sel_vector[iVar2] = sVar8;
          this->sel_size = this->sel_size + 1;
        }
        psVar1 = (other->sel).sel_vector;
        uVar5 = uVar10;
        if (psVar1 != (sel_t *)0x0) {
          uVar5 = (ulong)psVar1[uVar10];
        }
        local_60.sel_vector[uVar10] = (sel_t)uVar5;
        sVar8 = sVar8 + 1;
        uVar10 = uVar10 + 1;
      }
      this_ = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
               ::operator->(this_00)->chunk;
      other_00 = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                  ::operator->(&other->reservoir_chunk)->chunk;
      UpdateSampleAppend(this,this_,other_00,&local_60,(idx_t)local_48);
      iVar2 = GetTuplesSeen(other);
      pBVar6 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
               ::operator->(&(this->super_BlockingSample).base_reservoir_sample);
      pBVar6->num_entries_seen_total = pBVar6->num_entries_seen_total + iVar2;
      iVar2 = GetTuplesSeen(this);
      if (0x1dfff < iVar2) {
        ConvertToReservoirSample(this);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_60.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
  }
  return;
}

Assistant:

void ReservoirSample::SimpleMerge(ReservoirSample &other) {
	D_ASSERT(GetPriorityQueueSize() == 0);
	D_ASSERT(other.GetPriorityQueueSize() == 0);
	D_ASSERT(GetSamplingState() == SamplingState::RANDOM);
	D_ASSERT(other.GetSamplingState() == SamplingState::RANDOM);

	if (other.GetActiveSampleCount() == 0 && other.GetTuplesSeen() == 0) {
		return;
	}

	if (GetActiveSampleCount() == 0 && GetTuplesSeen() == 0) {
		sel = SelectionVector(other.sel);
		sel_size = other.sel_size;
		base_reservoir_sample->num_entries_seen_total = other.GetTuplesSeen();
		return;
	}

	idx_t total_seen = GetTuplesSeen() + other.GetTuplesSeen();

	auto weight_tuples_this = static_cast<double>(GetTuplesSeen()) / static_cast<double>(total_seen);
	auto weight_tuples_other = static_cast<double>(other.GetTuplesSeen()) / static_cast<double>(total_seen);

	// If weights don't add up to 1, most likely a simple merge occured and no new samples were added.
	// if that is the case, add the missing weight to the lower weighted sample to adjust.
	// this is to avoid cases where if you have a 20k row table and add another 20k rows row by row
	// then eventually the missing weights will add up, and get you a more even distribution
	if (weight_tuples_this + weight_tuples_other < 1) {
		weight_tuples_other += 1 - (weight_tuples_other + weight_tuples_this);
	}

	idx_t keep_from_this = 0;
	idx_t keep_from_other = 0;
	D_ASSERT(stats_sample);
	D_ASSERT(sample_count == FIXED_SAMPLE_SIZE);
	D_ASSERT(sample_count == other.sample_count);
	auto sample_count_double = static_cast<double>(sample_count);

	if (weight_tuples_this > weight_tuples_other) {
		keep_from_this = MinValue<idx_t>(static_cast<idx_t>(round(sample_count_double * weight_tuples_this)),
		                                 GetActiveSampleCount());
		keep_from_other = MinValue<idx_t>(sample_count - keep_from_this, other.GetActiveSampleCount());
	} else {
		keep_from_other = MinValue<idx_t>(static_cast<idx_t>(round(sample_count_double * weight_tuples_other)),
		                                  other.GetActiveSampleCount());
		keep_from_this = MinValue<idx_t>(sample_count - keep_from_other, GetActiveSampleCount());
	}

	D_ASSERT(keep_from_this <= GetActiveSampleCount());
	D_ASSERT(keep_from_other <= other.GetActiveSampleCount());
	D_ASSERT(keep_from_other + keep_from_this <= FIXED_SAMPLE_SIZE);
	idx_t size_after_merge = MinValue<idx_t>(keep_from_other + keep_from_this, FIXED_SAMPLE_SIZE);

	// Check if appending the other samples to this will go over the sample chunk size
	if (reservoir_chunk->chunk.size() + keep_from_other > GetReservoirChunkCapacity<idx_t>()) {
		Vacuum();
	}

	D_ASSERT(size_after_merge <= other.GetActiveSampleCount() + GetActiveSampleCount());
	SelectionVector chunk_sel(keep_from_other);
	auto offset = reservoir_chunk->chunk.size();
	for (idx_t i = keep_from_this; i < size_after_merge; i++) {
		if (i >= GetActiveSampleCount()) {
			D_ASSERT(sel_size >= GetActiveSampleCount());
			sel.set_index(GetActiveSampleCount(), offset);
			sel_size += 1;
		} else {
			sel.set_index(i, offset);
		}
		chunk_sel.set_index(i - keep_from_this, other.sel.get_index(i - keep_from_this));
		offset += 1;
	}

	D_ASSERT(GetActiveSampleCount() == size_after_merge);

	// Copy the rows that make it to the sample from other and put them into this.
	UpdateSampleAppend(reservoir_chunk->chunk, other.reservoir_chunk->chunk, chunk_sel, keep_from_other);
	base_reservoir_sample->num_entries_seen_total += other.GetTuplesSeen();

	// if THIS has too many samples now, we conver it to a slower sample.
	if (GetTuplesSeen() >= FIXED_SAMPLE_SIZE * FAST_TO_SLOW_THRESHOLD) {
		ConvertToReservoirSample();
	}
	Verify();
}